

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BBoxRenderCase::init
          (BBoxRenderCase *this,EVP_PKEY_CTX *ctx)

{
  MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *this_00;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  *this_01;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  *this_02;
  pointer *ppIVar1;
  BBoxSize BVar2;
  Context *pCVar3;
  Context *pCVar4;
  TestLog *log;
  pointer __a;
  pointer pIVar5;
  pointer pIVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  ContextType ctxType;
  deUint32 dVar10;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  undefined4 extraout_var;
  RenderTarget *pRVar11;
  size_t sVar12;
  ShaderProgram *this_03;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar13;
  ObjectWrapper *pOVar14;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar15;
  pointer pIVar16;
  pointer extraout_RAX;
  pointer pIVar17;
  TestError *this_04;
  NotSupportedError *pNVar18;
  long *plVar19;
  int (*paiVar20) [2];
  int i;
  long lVar21;
  size_type *psVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  int aiVar24 [2];
  IterationConfig *__args;
  IterationConfig *extraout_RDX;
  IterationConfig *__args_00;
  long lVar25;
  ulong uVar26;
  BBoxRenderCase *pBVar27;
  ulong uVar28;
  pointer pIVar29;
  char *pcVar30;
  char *pcVar31;
  uint uVar32;
  ulong uVar33;
  ScopedLogSection section;
  Texture colorAttachment;
  undefined1 local_2c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  undefined1 local_298 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  undefined1 local_270 [32];
  int local_250;
  int local_24c;
  BBoxRenderCase *local_248;
  undefined1 local_240 [32];
  string local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  int local_1e0 [2];
  undefined1 local_1d8 [8];
  IVec2 IStack_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [6];
  ios_base local_160 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_148;
  undefined1 local_128 [216];
  string local_50;
  
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar21 = CONCAT44(extraout_var,iVar9);
  local_250 = 0x200;
  local_24c = 0x200;
  if (this->m_renderTarget == RENDERTARGET_DEFAULT) {
    pRVar11 = Context::getRenderTarget((this->super_TestCase).m_context);
    local_250 = pRVar11->m_width;
    pRVar11 = Context::getRenderTarget((this->super_TestCase).m_context);
    local_24c = pRVar11->m_height;
  }
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar7 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar7) {
    bVar8 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_primitive_bounding_box");
    if (!bVar8) {
      pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1d8 = (undefined1  [8])local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d8,"Test requires GL_EXT_primitive_bounding_box extension","");
      tcu::NotSupportedError::NotSupportedError(pNVar18,(string *)local_1d8);
      __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    if (!bVar7) {
      if ((this->m_hasTessellationStage == true) &&
         (bVar8 = glu::ContextInfo::isExtensionSupported
                            (((this->super_TestCase).m_context)->m_contextInfo,
                             "GL_EXT_tessellation_shader"), !bVar8)) {
        pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_1d8 = (undefined1  [8])local_1c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d8,"Test requires GL_EXT_tessellation_shader extension","");
        tcu::NotSupportedError::NotSupportedError(pNVar18,(string *)local_1d8);
        __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      if (((!bVar7) && (this->m_hasGeometryStage == true)) &&
         (bVar7 = glu::ContextInfo::isExtensionSupported
                            (((this->super_TestCase).m_context)->m_contextInfo,
                             "GL_EXT_geometry_shader"), !bVar7)) {
        pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_1d8 = (undefined1  [8])local_1c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d8,"Test requires GL_EXT_geometry_shader extension","");
        tcu::NotSupportedError::NotSupportedError(pNVar18,(string *)local_1d8);
        __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
  }
  if ((this->m_renderTarget == RENDERTARGET_DEFAULT) && ((local_250 < 0x100 || (local_24c < 0x100)))
     ) {
    pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    local_220._M_string_length = 0;
    local_220.field_2._M_local_buf[0] = '\0';
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
    local_240._0_8_ = *plVar19;
    psVar22 = (size_type *)(plVar19 + 2);
    if ((size_type *)local_240._0_8_ == psVar22) {
      local_240._16_8_ = *psVar22;
      local_240._24_8_ = plVar19[3];
      local_240._0_8_ = local_240 + 0x10;
    }
    else {
      local_240._16_8_ = *psVar22;
    }
    local_240._8_8_ = plVar19[1];
    *plVar19 = (long)psVar22;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    local_1e0[1] = 0x100;
    de::toString<int>((string *)&local_200,local_1e0 + 1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_200);
    plVar19 = (long *)std::__cxx11::string::append(local_270);
    local_298._0_8_ = *plVar19;
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar19 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._0_8_ == paVar23) {
      local_288._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_288._8_8_ = plVar19[3];
      local_298._0_8_ = &local_288;
    }
    else {
      local_288._M_allocated_capacity = paVar23->_M_allocated_capacity;
    }
    local_298._8_8_ = plVar19[1];
    *plVar19 = (long)paVar23;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    local_1e0[0] = 0x100;
    de::toString<int>(&local_50,local_1e0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                   &local_50);
    paiVar20 = (int (*) [2])std::__cxx11::string::append(local_2c0);
    local_1d8 = *(undefined1 (*) [8])paiVar20;
    aiVar24 = (int  [2])(paiVar20 + 2);
    if ((int  [2])local_1d8 == aiVar24) {
      local_1c8[0]._0_8_ = *(undefined8 *)aiVar24;
      local_1c8[0]._8_8_ = *(float (*) [2])(paiVar20 + 3);
      local_1d8 = (undefined1  [8])local_1c8;
    }
    else {
      local_1c8[0]._0_8_ = *(undefined8 *)aiVar24;
    }
    IStack_1d0.m_data = paiVar20[1];
    *paiVar20 = aiVar24;
    paiVar20[1] = (int  [2])0x0;
    *(undefined1 *)paiVar20[2] = 0;
    tcu::NotSupportedError::NotSupportedError(pNVar18,(string *)local_1d8);
    __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_1d8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&IStack_1d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&IStack_1d0,"Setting primitive bounding box ",0x1f);
  if (this->m_calcPerPrimitiveBBox == false) {
    BVar2 = this->m_bboxSize;
    if (BVar2 == BBOXSIZE_EQUAL) {
      pcVar30 = "to exactly cover rendered grid";
    }
    else if (BVar2 == BBOXSIZE_LARGER) {
      pcVar30 = "to cover the grid and include some padding";
    }
    else {
      pcVar30 = (char *)0x0;
      if (BVar2 == BBOXSIZE_SMALLER) {
        pcVar30 = "to cover only a subset of the grid";
      }
    }
  }
  else {
    pcVar30 = "to exactly cover each generated primitive";
  }
  if (pcVar30 == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&IStack_1d0 +
                    (int)*(size_type *)((long)IStack_1d0.m_data + -0x18));
  }
  else {
    sVar12 = strlen(pcVar30);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&IStack_1d0,pcVar30,sVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&IStack_1d0,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&IStack_1d0,"Rendering with vertex",0x15);
  pcVar30 = "-tessellation{ctrl,eval}";
  pcVar31 = SSBOArrayLengthTests::init::arraysSized + 1;
  bVar7 = this->m_hasTessellationStage == false;
  if (bVar7) {
    pcVar30 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  lVar25 = 0x18;
  if (bVar7) {
    lVar25 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&IStack_1d0,pcVar30,lVar25);
  if ((ulong)this->m_hasGeometryStage != 0) {
    pcVar31 = "-geometry";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&IStack_1d0,pcVar31,(ulong)this->m_hasGeometryStage * 9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&IStack_1d0,"-fragment program.\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&IStack_1d0,"Set bounding box using ",0x17);
  pcVar30 = "PRIMITIVE_BOUNDING_BOX_EXT state";
  pcVar31 = "gl_BoundingBoxEXT output";
  if (this->m_useGlobalState != false) {
    pcVar31 = "PRIMITIVE_BOUNDING_BOX_EXT state";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&IStack_1d0,pcVar31,(ulong)this->m_useGlobalState * 8 + 0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&IStack_1d0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&IStack_1d0,"Verifying rendering results are valid within the bounding box."
             ,0x3e);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&IStack_1d0);
  std::ios_base::~ios_base(local_160);
  local_128[0x10] = 0;
  local_128._17_8_ = 0;
  local_128._0_8_ = (pointer)0x0;
  local_128[8] = 0;
  local_128._9_7_ = 0;
  memset(local_1d8,0,0xac);
  pCVar3 = (this->super_TestCase).m_context;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(local_270,this);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)local_298,(_anonymous_namespace_ *)pCVar3,(Context *)local_270._0_8_,pcVar30)
  ;
  local_2c0._0_8_ = (ulong)(uint)local_2c0._4_4_ << 0x20;
  pcVar31 = local_2b0._M_local_buf + 8;
  local_2c0._8_8_ = pcVar31;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_2c0 + 8),local_298._0_8_,(char *)(local_298._8_8_ + local_298._0_8_));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d8 + (local_2c0._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_2c0 + 8));
  if ((char *)local_2c0._8_8_ != pcVar31) {
    operator_delete((void *)local_2c0._8_8_,local_2b0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._0_8_ != &local_288) {
    operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
  }
  pCVar3 = (Context *)(local_270 + 0x10);
  if ((Context *)local_270._0_8_ != pCVar3) {
    operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
  }
  pCVar4 = (this->super_TestCase).m_context;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(local_270,this);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)local_298,(_anonymous_namespace_ *)pCVar4,(Context *)local_270._0_8_,pcVar30)
  ;
  local_2c0._0_4_ = 1;
  local_2c0._8_8_ = pcVar31;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_2c0 + 8),local_298._0_8_,(char *)(local_298._8_8_ + local_298._0_8_));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d8 + (local_2c0._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_2c0 + 8));
  if ((char *)local_2c0._8_8_ != pcVar31) {
    operator_delete((void *)local_2c0._8_8_,local_2b0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._0_8_ != &local_288) {
    operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
  }
  if ((Context *)local_270._0_8_ != pCVar3) {
    operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
  }
  local_248 = this;
  if (this->m_hasTessellationStage == true) {
    pCVar4 = (this->super_TestCase).m_context;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(local_240,this);
    (anonymous_namespace)::specializeShader_abi_cxx11_
              ((string *)local_270,(_anonymous_namespace_ *)pCVar4,(Context *)local_240._0_8_,
               pcVar30);
    local_2c0._0_4_ = 3;
    local_2c0._8_8_ = pcVar31;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_2c0 + 8),local_270._0_8_,
               (pointer)(local_270._0_8_ + local_270._8_8_));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1d8 + (local_2c0._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_2c0 + 8)
               );
    pCVar4 = (this->super_TestCase).m_context;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])(&local_200,this);
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_220,(_anonymous_namespace_ *)pCVar4,(Context *)local_200._M_allocated_capacity
               ,pcVar30);
    local_298._0_4_ = 4;
    local_298._8_8_ = local_288._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_298 + 8),local_220._M_dataplus._M_p,
               local_220._M_dataplus._M_p + local_220._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1d8 + (local_298._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_298 + 8)
               );
    if ((char *)local_298._8_8_ != local_288._M_local_buf + 8) {
      operator_delete((void *)local_298._8_8_,local_288._8_8_ + 1);
    }
    this = local_248;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,
                      CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                               local_220.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_allocated_capacity != &local_1f0) {
      operator_delete((void *)local_200._M_allocated_capacity,local_1f0._M_allocated_capacity + 1);
    }
    if ((char *)local_2c0._8_8_ != pcVar31) {
      operator_delete((void *)local_2c0._8_8_,local_2b0._8_8_ + 1);
    }
    if ((Context *)local_270._0_8_ != pCVar3) {
      operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
    }
    if ((Context *)local_240._0_8_ != (Context *)(local_240 + 0x10)) {
      operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
    }
  }
  if (this->m_hasGeometryStage == true) {
    pCVar4 = (this->super_TestCase).m_context;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(local_270,this);
    (anonymous_namespace)::specializeShader_abi_cxx11_
              ((string *)local_298,(_anonymous_namespace_ *)pCVar4,(Context *)local_270._0_8_,
               pcVar30);
    local_2c0._0_4_ = 2;
    local_2c0._8_8_ = pcVar31;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_2c0 + 8),local_298._0_8_,(char *)(local_298._8_8_ + local_298._0_8_)
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1d8 + (local_2c0._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_2c0 + 8)
               );
    if ((char *)local_2c0._8_8_ != pcVar31) {
      operator_delete((void *)local_2c0._8_8_,local_2b0._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._0_8_ != &local_288) {
      operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
    }
    if ((Context *)local_270._0_8_ != pCVar3) {
      operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
    }
  }
  this_03 = (ShaderProgram *)operator_new(0xd0);
  glu::ShaderProgram::ShaderProgram
            (this_03,((this->super_TestCase).m_context)->m_renderCtx,(ProgramSources *)local_1d8);
  local_2c0._0_8_ = (ShaderProgram *)0x0;
  this_00 = &this->m_program;
  if ((this->m_program).
      super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr !=
      this_03) {
    de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
              (&this_00->
                super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
    (this_00->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).m_data.
    ptr = this_03;
  }
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
            ((UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)local_2c0);
  dVar10 = (**(code **)(lVar21 + 0x800))();
  glu::checkError(dVar10,"build program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0x2b4);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_2c0._0_8_ = &local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"ShaderProgram","");
  local_298._0_8_ = &local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"Shader program","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)local_270,log,(string *)local_2c0,(string *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._0_8_ != &local_288) {
    operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._0_8_ != &local_2b0) {
    operator_delete((void *)local_2c0._0_8_,local_2b0._M_allocated_capacity + 1);
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).
                  super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
                  m_data.ptr);
  tcu::TestLog::endSection((TestLog *)local_270._0_8_);
  if ((((this_00->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).
        m_data.ptr)->m_program).m_info.linkOk != false) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_128);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_148);
    lVar25 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1d8 + lVar25));
      pBVar27 = local_248;
      lVar25 = lVar25 + -0x18;
    } while (lVar25 != -0x18);
    if (local_248->m_renderTarget == RENDERTARGET_FBO) {
      iVar9 = (*((local_248->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      pOVar13 = glu::objectTraits(OBJECTTYPE_TEXTURE);
      glu::ObjectWrapper::ObjectWrapper
                ((ObjectWrapper *)local_1d8,(Functions *)CONCAT44(extraout_var_00,iVar9),pOVar13);
      (**(code **)(lVar21 + 0xb8))(0xde1,local_1c8[0]._M_allocated_capacity & 0xffffffff);
      (**(code **)(lVar21 + 0x1380))(0xde1,1,0x8058,0x200,0x200);
      dVar10 = (**(code **)(lVar21 + 0x800))();
      glu::checkError(dVar10,"gen tex",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                      ,0x2c5);
      pOVar14 = (ObjectWrapper *)operator_new(0x18);
      iVar9 = (*((pBVar27->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      pOVar13 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
      glu::ObjectWrapper::ObjectWrapper
                (pOVar14,(Functions *)CONCAT44(extraout_var_01,iVar9),pOVar13);
      local_2c0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      this_01 = &pBVar27->m_fbo;
      if (&((pBVar27->m_fbo).
            super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
            .m_data.ptr)->super_ObjectWrapper != pOVar14) {
        de::details::
        UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
        ::reset(&this_01->
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
               );
        (this_01->
        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
        ).m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)pOVar14;
      }
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
               *)local_2c0);
      (**(code **)(lVar21 + 0x78))
                (0x8ca9,(((this_01->
                          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                          ).m_data.ptr)->super_ObjectWrapper).m_object);
      (**(code **)(lVar21 + 0x6a0))
                (0x8ca9,0x8ce0,0xde1,local_1c8[0]._M_allocated_capacity & 0xffffffff,0);
      dVar10 = (**(code **)(lVar21 + 0x800))();
      glu::checkError(dVar10,"attach",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                      ,0x2ca);
      (**(code **)(lVar21 + 0x78))(0x8ca9,0);
      glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)local_1d8);
    }
    local_1d8._0_4_ = 0;
    local_1d8._4_4_ = 0;
    IStack_1d0.m_data[0] = 0;
    IStack_1d0.m_data[1] = 0;
    local_1c8[0]._0_4_ = 0.0;
    local_1c8[0]._4_4_ = 0.0;
    (*(pBVar27->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xb])(pBVar27);
    pOVar14 = (ObjectWrapper *)operator_new(0x18);
    iVar9 = (*((pBVar27->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pOVar13 = glu::objectTraits(OBJECTTYPE_BUFFER);
    glu::ObjectWrapper::ObjectWrapper(pOVar14,(Functions *)CONCAT44(extraout_var_02,iVar9),pOVar13);
    local_2c0._0_8_ = (ShaderProgram *)0x0;
    this_02 = &pBVar27->m_vbo;
    if (&((pBVar27->m_vbo).
          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
          .m_data.ptr)->super_ObjectWrapper != pOVar14) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
      ::reset(&this_02->
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
             );
      (this_02->
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
      ).m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)1> *)pOVar14;
    }
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
    ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
             *)local_2c0);
    (**(code **)(lVar21 + 0x40))
              (0x8892,(((this_02->
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                        ).m_data.ptr)->super_ObjectWrapper).m_object);
    (**(code **)(lVar21 + 0x150))
              (0x8892,(long)(IStack_1d0.m_data[0] - local_1d8._0_4_) & 0xfffffffffffffff0,local_1d8,
               0x88e4);
    dVar10 = (**(code **)(lVar21 + 0x800))();
    glu::checkError(dVar10,"create vbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0x2d8);
    iVar9 = extraout_EAX;
    if ((int  [2])local_1d8 != (int  [2])0x0) {
      operator_delete((void *)local_1d8,local_1c8[0]._M_allocated_capacity - (long)local_1d8);
      iVar9 = extraout_EAX_00;
    }
    if (0 < pBVar27->m_numIterations) {
      uVar33 = 0;
      do {
        (*(pBVar27->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
                  ((IterationConfig *)local_1d8,pBVar27,uVar33,&local_250);
        __a = (pBVar27->m_iterationConfigs).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
              ._M_impl.super__Vector_impl_data._M_finish;
        if (__a == (pBVar27->m_iterationConfigs).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          pIVar5 = (pBVar27->m_iterationConfigs).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((long)__a - (long)pIVar5 == 0x7fffffffffffffc0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar28 = (long)__a - (long)pIVar5 >> 6;
          uVar15 = uVar28;
          if (__a == pIVar5) {
            uVar15 = 1;
          }
          uVar26 = uVar15 + uVar28;
          if (0x1fffffffffffffe < uVar26) {
            uVar26 = 0x1ffffffffffffff;
          }
          if (CARRY8(uVar15,uVar28)) {
            uVar26 = 0x1ffffffffffffff;
          }
          if (uVar26 == 0) {
            pIVar16 = (pointer)0x0;
            __args_00 = __args;
          }
          else {
            pIVar16 = (pointer)operator_new(uVar26 << 6);
            __args_00 = extraout_RDX;
          }
          std::
          allocator_traits<std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>>
          ::
          construct<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>
                    ((allocator_type *)(pIVar16 + uVar28),(IterationConfig *)local_1d8,__args_00);
          pBVar27 = local_248;
          pIVar17 = pIVar5;
          pIVar6 = extraout_RAX;
          pIVar29 = pIVar16;
          while (__a != pIVar17) {
            lVar21 = 0;
            do {
              (pIVar29->viewportPos).m_data[lVar21] = (pIVar17->viewportPos).m_data[lVar21];
              lVar21 = lVar21 + 1;
            } while (lVar21 == 1);
            lVar21 = 2;
            do {
              (pIVar29->viewportPos).m_data[lVar21] = (pIVar17->viewportPos).m_data[lVar21];
              lVar21 = lVar21 + 1;
            } while (lVar21 == 3);
            lVar21 = 4;
            do {
              (pIVar29->viewportPos).m_data[lVar21] = (pIVar17->viewportPos).m_data[lVar21];
              lVar21 = lVar21 + 1;
            } while (lVar21 == 5);
            lVar21 = 6;
            do {
              (pIVar29->viewportPos).m_data[lVar21] = (pIVar17->viewportPos).m_data[lVar21];
              lVar21 = lVar21 + 1;
            } while (lVar21 == 7);
            lVar21 = 8;
            do {
              (pIVar29->viewportPos).m_data[lVar21] = (pIVar17->viewportPos).m_data[lVar21];
              lVar21 = lVar21 + 1;
            } while (lVar21 != 0xc);
            lVar21 = 0xc;
            do {
              (pIVar29->viewportPos).m_data[lVar21] = (pIVar17->viewportPos).m_data[lVar21];
              lVar21 = lVar21 + 1;
            } while (lVar21 != 0x10);
            pIVar29 = pIVar29 + 1;
            pIVar17 = pIVar17 + 1;
            pIVar6 = pIVar17;
          }
          iVar9 = (int)pIVar6;
          if (pIVar5 != (pointer)0x0) {
            operator_delete(pIVar5,(long)(local_248->m_iterationConfigs).
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pIVar5);
            iVar9 = extraout_EAX_02;
          }
          (pBVar27->m_iterationConfigs).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
          ._M_impl.super__Vector_impl_data._M_start = pIVar16;
          (pBVar27->m_iterationConfigs).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
          ._M_impl.super__Vector_impl_data._M_finish = pIVar29 + 1;
          (pBVar27->m_iterationConfigs).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pIVar16 + uVar26;
        }
        else {
          std::
          allocator_traits<std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>>
          ::
          construct<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>
                    ((allocator_type *)__a,(IterationConfig *)local_1d8,__args);
          ppIVar1 = &(pBVar27->m_iterationConfigs).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
          iVar9 = extraout_EAX_01;
        }
        uVar32 = (int)uVar33 + 1;
        uVar33 = (ulong)uVar32;
      } while ((int)uVar32 < pBVar27->m_numIterations);
    }
    return iVar9;
  }
  this_04 = (TestError *)__cxa_allocate_exception(0x38);
  local_2c0._0_8_ = &local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"failed to build program","");
  tcu::TestError::TestError(this_04,(string *)local_2c0);
  __cxa_throw(this_04,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BBoxRenderCase::init (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const tcu::IVec2		renderTargetSize	= (m_renderTarget == RENDERTARGET_DEFAULT) ?
													(tcu::IVec2(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight())) :
													(tcu::IVec2(FBO_SIZE, FBO_SIZE));
	const bool				supportsES32		= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	// requirements
	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_primitive_bounding_box"))
		throw tcu::NotSupportedError("Test requires GL_EXT_primitive_bounding_box extension");
	if (!supportsES32 && m_hasTessellationStage && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");
	if (!supportsES32 && m_hasGeometryStage && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_geometry_shader extension");
	if (m_renderTarget == RENDERTARGET_DEFAULT && (renderTargetSize.x() < RENDER_TARGET_MIN_SIZE || renderTargetSize.y() < RENDER_TARGET_MIN_SIZE))
		throw tcu::NotSupportedError(std::string() + "Test requires " + de::toString<int>(RENDER_TARGET_MIN_SIZE) + "x" + de::toString<int>(RENDER_TARGET_MIN_SIZE) + " default framebuffer");

	// log case specifics
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Setting primitive bounding box "
			<< ((m_calcPerPrimitiveBBox)         ? ("to exactly cover each generated primitive")
			  : (m_bboxSize == BBOXSIZE_EQUAL)   ? ("to exactly cover rendered grid")
			  : (m_bboxSize == BBOXSIZE_LARGER)  ? ("to cover the grid and include some padding")
			  : (m_bboxSize == BBOXSIZE_SMALLER) ? ("to cover only a subset of the grid")
			  : (DE_NULL))
			<< ".\n"
		<< "Rendering with vertex"
			<< ((m_hasTessellationStage) ? ("-tessellation{ctrl,eval}") : (""))
			<< ((m_hasGeometryStage) ? ("-geometry") : (""))
			<< "-fragment program.\n"
		<< "Set bounding box using "
			<< ((m_useGlobalState) ? ("PRIMITIVE_BOUNDING_BOX_EXT state") : ("gl_BoundingBoxEXT output"))
			<< "\n"
		<< "Verifying rendering results are valid within the bounding box."
		<< tcu::TestLog::EndMessage;

	// resources

	{
		glu::ProgramSources sources;
		sources << glu::VertexSource(specializeShader(m_context, genVertexSource().c_str()));
		sources << glu::FragmentSource(specializeShader(m_context, genFragmentSource().c_str()));

		if (m_hasTessellationStage)
			sources << glu::TessellationControlSource(specializeShader(m_context, genTessellationControlSource().c_str()))
					<< glu::TessellationEvaluationSource(specializeShader(m_context, genTessellationEvaluationSource().c_str()));
		if (m_hasGeometryStage)
			sources << glu::GeometrySource(specializeShader(m_context, genGeometrySource().c_str()));

		m_program = de::MovePtr<glu::ShaderProgram>(new glu::ShaderProgram(m_context.getRenderContext(), sources));
		GLU_EXPECT_NO_ERROR(gl.getError(), "build program");

		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "ShaderProgram", "Shader program");
			m_testCtx.getLog() << *m_program;
		}

		if (!m_program->isOk())
			throw tcu::TestError("failed to build program");
	}

	if (m_renderTarget == RENDERTARGET_FBO)
	{
		glu::Texture colorAttachment(m_context.getRenderContext());

		gl.bindTexture(GL_TEXTURE_2D, *colorAttachment);
		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, FBO_SIZE, FBO_SIZE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen tex");

		m_fbo = de::MovePtr<glu::Framebuffer>(new glu::Framebuffer(m_context.getRenderContext()));
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, **m_fbo);
		gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, *colorAttachment, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "attach");

		// unbind to prevent texture name deletion from removing it from current fbo attachments
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
	}

	{
		std::vector<tcu::Vec4> data;

		getAttributeData(data);

		m_vbo = de::MovePtr<glu::Buffer>(new glu::Buffer(m_context.getRenderContext()));
		gl.bindBuffer(GL_ARRAY_BUFFER, **m_vbo);
		gl.bufferData(GL_ARRAY_BUFFER, (int)(data.size() * sizeof(tcu::Vec4)), &data[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "create vbo");
	}

	// Iterations
	for (int iterationNdx = 0; iterationNdx < m_numIterations; ++iterationNdx)
		m_iterationConfigs.push_back(generateConfig(iterationNdx, renderTargetSize));
}